

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O1

bool __thiscall
SatPos::Calculatetk(SatPos *this,SATTIME ObsTime,SATTIME RefTime,NavSys flag,double *tk)

{
  int iVar1;
  double dVar2;
  SATTIME SVar3;
  SATTIME local_38;
  double local_28;
  SATTIME local_20;
  
  local_20.SOW = ObsTime.SOW;
  local_20.Week = ObsTime.Week;
  local_38.SOW = -1.0;
  local_28 = 0.0;
  iVar1 = RefTime.Week;
  dVar2 = RefTime.SOW;
  if ((flag != GPS) && (iVar1 = local_38.Week, dVar2 = local_38.SOW, flag == BDS)) {
    SVar3._0_8_ = RefTime._0_8_ & 0xffffffff;
    SVar3.SOW = RefTime.SOW;
    BDST2GPST(SVar3,&local_38);
    local_28 = 3600.0;
    iVar1 = local_38.Week;
    dVar2 = local_38.SOW;
  }
  local_38.SOW = dVar2;
  local_38.Week = iVar1;
  SVar3 = SATTIME::operator-(&local_20,&local_38);
  dVar2 = (double)(SVar3.Week * 0x93a80) + SVar3.SOW;
  *tk = dVar2;
  if (flag == GPS) {
    local_28 = 7200.0;
  }
  return ABS(dVar2) <= local_28;
}

Assistant:

bool SatPos::Calculatetk(const SATTIME ObsTime, const SATTIME RefTime, NavSys flag, double &tk)
{
    SATTIME RefTime_GPST;
    if(flag == BDS)
        BDST2GPST(RefTime, RefTime_GPST);
    else if(flag == GPS)
        RefTime_GPST = RefTime;

    SATTIME tk_GPST = ObsTime - RefTime_GPST;
    tk = tk_GPST.Week * 604800 + tk_GPST.SOW;
    // 星历有效期
    double expired;
    if(flag == GPS)
        expired = 2 * 3600;
    else if(flag == BDS)
        expired = 3600;
    else
        expired = 0;
    
    if(abs(tk) > expired)
        return false;
    return true;
}